

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

unique_ptr<int,_std::default_delete<int>_>
(anonymous_namespace)::roundtrip<std::unique_ptr<int,std::default_delete<int>>>
          (unique_ptr<int,_std::default_delete<int>_> *in)

{
  __uniq_ptr_data<int,_std::default_delete<int>,_true,_true> in_RDI;
  unique_ptr<int,_std::default_delete<int>_> *out;
  unique_ptr<int,_std::default_delete<int>_> *in_stack_000001f8;
  unique_ptr<int,_std::default_delete<int>_> *in_stack_00000200;
  
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,_std::default_delete<int>_> *)
             in_RDI.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl);
  roundtrip_into<std::unique_ptr<int,std::default_delete<int>>,std::unique_ptr<int,std::default_delete<int>>>
            (in_stack_00000200,in_stack_000001f8);
  return (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
         (tuple<int_*,_std::default_delete<int>_>)
         in_RDI.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}